

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

void A_Unblock(AActor *self,bool drop)

{
  uint uVar1;
  bool bVar2;
  DDropItem *pDVar3;
  PClassActor *pPVar4;
  FName local_1c;
  
  uVar1 = (self->flags).Value;
  if ((uVar1 >> 0x1e & 1) != 0) {
    self->Alpha = 1.0;
    self->visdir = '\0';
  }
  (self->flags).Value = uVar1 & 0xfffffffd;
  if ((self->Conversation == (FStrifeDialogueNode *)0x0) ||
     (pPVar4 = self->Conversation->DropType, pPVar4 == (PClassActor *)0x0)) {
    self->Conversation = (FStrifeDialogueNode *)0x0;
    if (drop) {
      bVar2 = DObject::IsKindOf((DObject *)self,APlayerPawn::RegistrationInfo.MyClass);
      if (!bVar2) {
        pDVar3 = AActor::GetDropItems(self);
        if (pDVar3 != (DDropItem *)0x0) {
          do {
            local_1c.Index = (pDVar3->Name).Index;
            if (local_1c.Index != 0) {
              pPVar4 = PClass::FindActor(&local_1c);
              if (pPVar4 != (PClassActor *)0x0) {
                P_DropItem(self,pPVar4,pDVar3->Amount,pDVar3->Probability);
              }
            }
            pDVar3 = pDVar3->Next;
          } while (pDVar3 != (DDropItem *)0x0);
        }
      }
    }
  }
  else {
    P_DropItem(self,pPVar4,-1,0x100);
    self->Conversation = (FStrifeDialogueNode *)0x0;
  }
  return;
}

Assistant:

void A_Unblock(AActor *self, bool drop)
{
	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1.;
		self->visdir = 0;
	}

	self->flags &= ~MF_SOLID;

	// If the actor has a conversation that sets an item to drop, drop that.
	if (self->Conversation != NULL && self->Conversation->DropType != NULL)
	{
		P_DropItem (self, self->Conversation->DropType, -1, 256);
		self->Conversation = NULL;
		return;
	}

	self->Conversation = NULL;

	// If the actor has attached metadata for items to drop, drop those.
	if (drop && !self->IsKindOf (RUNTIME_CLASS (APlayerPawn)))	// [GRB]
	{
		DDropItem *di = self->GetDropItems();

		if (di != NULL)
		{
			while (di != NULL)
			{
				if (di->Name != NAME_None)
				{
					PClassActor *ti = PClass::FindActor(di->Name);
					if (ti != NULL)
					{
						P_DropItem (self, ti, di->Amount, di->Probability);
					}
				}
				di = di->Next;
			}
		}
	}
}